

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_slliq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i64 ret;
  TCGv_i64 t;
  TCGv_i64 t1;
  TCGv_i64 t0;
  int sh;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = SH(ctx->opcode);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  t = tcg_temp_new_i64(tcg_ctx_00);
  uVar2 = rS(ctx->opcode);
  tcg_gen_rotli_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar2],uVar1);
  gen_load_spr(tcg_ctx_00,t,0);
  gen_store_spr(tcg_ctx_00,0,ret);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,(ulong)(uint)(-1 << ((byte)uVar1 & 0x1f)));
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,t,t,(ulong)(-1 << ((byte)uVar1 & 0x1f) ^ 0xffffffff));
  uVar1 = rA(ctx->opcode);
  tcg_gen_or_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],ret,t);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  tcg_temp_free_i64(tcg_ctx_00,t);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_slliq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sh = SH(ctx->opcode);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_rotli_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], sh);
    gen_load_spr(tcg_ctx, t1, SPR_MQ);
    gen_store_spr(tcg_ctx, SPR_MQ, t0);
    tcg_gen_andi_tl(tcg_ctx, t0, t0,  (0xFFFFFFFFU << sh));
    tcg_gen_andi_tl(tcg_ctx, t1, t1, ~(0xFFFFFFFFU << sh));
    tcg_gen_or_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}